

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

ggml_status ggml_backend_view_init(ggml_tensor *tensor)

{
  ggml_tensor *pgVar1;
  ggml_backend_buffer_t pgVar2;
  void *pvVar3;
  _func_ggml_status_ggml_backend_buffer_t_ggml_tensor_ptr *UNRECOVERED_JUMPTABLE;
  ggml_status gVar4;
  char *pcVar5;
  int line;
  
  if (tensor->buffer == (ggml_backend_buffer *)0x0) {
    pgVar1 = tensor->view_src;
    if (pgVar1 == (ggml_tensor *)0x0) {
      pcVar5 = "tensor->view_src != NULL";
      line = 0x670;
    }
    else {
      pgVar2 = pgVar1->buffer;
      if (pgVar2 == (ggml_backend_buffer_t)0x0) {
        pcVar5 = "tensor->view_src->buffer != NULL";
        line = 0x671;
      }
      else {
        pvVar3 = pgVar1->data;
        if (pvVar3 != (void *)0x0) {
          tensor->buffer = pgVar2;
          tensor->data = (void *)((long)pvVar3 + tensor->view_offs);
          UNRECOVERED_JUMPTABLE = (pgVar2->iface).init_tensor;
          if (UNRECOVERED_JUMPTABLE !=
              (_func_ggml_status_ggml_backend_buffer_t_ggml_tensor_ptr *)0x0) {
            gVar4 = (*UNRECOVERED_JUMPTABLE)(pgVar2,tensor);
            return gVar4;
          }
          return GGML_STATUS_SUCCESS;
        }
        pcVar5 = "tensor->view_src->data != NULL";
        line = 0x672;
      }
    }
  }
  else {
    pcVar5 = "tensor->buffer == NULL";
    line = 0x66f;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

enum ggml_status ggml_backend_view_init(struct ggml_tensor * tensor) {
    GGML_ASSERT(tensor->buffer == NULL);
    GGML_ASSERT(tensor->view_src != NULL);
    GGML_ASSERT(tensor->view_src->buffer != NULL);
    GGML_ASSERT(tensor->view_src->data != NULL);

    tensor->buffer = tensor->view_src->buffer;
    tensor->data = (char *)tensor->view_src->data + tensor->view_offs;
    return ggml_backend_buffer_init_tensor(tensor->buffer, tensor);
}